

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

size_t __thiscall
gui::MultilineTextBox::findCaretOffset(MultilineTextBox *this,Vector2<unsigned_long> *caretPosition)

{
  pointer pSVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = ((long)(this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5) - 1;
  if (caretPosition->y <= uVar6) {
    uVar6 = caretPosition->y;
  }
  lVar5 = 0;
  lVar4 = 0;
  uVar3 = uVar6;
  while( true ) {
    pSVar1 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl
             .super__Vector_impl_data._M_start;
    bVar7 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar7) break;
    sVar2 = sf::String::getSize((String *)((long)&(pSVar1->m_string)._M_dataplus._M_p + lVar5));
    lVar4 = lVar4 + sVar2 + 1;
    lVar5 = lVar5 + 0x20;
  }
  sVar2 = sf::String::getSize(pSVar1 + uVar6);
  if (caretPosition->x <= sVar2) {
    sVar2 = caretPosition->x;
  }
  return sVar2 + lVar4;
}

Assistant:

size_t MultilineTextBox::findCaretOffset(const sf::Vector2<size_t>& caretPosition) const {
    size_t pos = 0;
    size_t y = std::min(caretPosition.y, boxStrings_.size() - 1);
    for (size_t i = 0; i < y; ++i) {
        pos += boxStrings_[i].getSize() + 1;
    }
    return pos + std::min(caretPosition.x, boxStrings_[y].getSize());
}